

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O0

int archive_write_set_skip_file(archive *_a,int64_t d,int64_t i)

{
  int iVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int magic_test;
  archive_write *a;
  char *in_stack_00000068;
  uint in_stack_00000070;
  uint in_stack_00000074;
  archive *in_stack_00000078;
  undefined4 local_4;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000078,in_stack_00000074,in_stack_00000070,in_stack_00000068);
  if (iVar1 == -0x1e) {
    local_4 = -0x1e;
  }
  else {
    *(undefined4 *)(in_RDI + 0x70) = 1;
    *(undefined8 *)(in_RDI + 0x78) = in_RSI;
    *(undefined8 *)(in_RDI + 0x80) = in_RDX;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
archive_write_set_skip_file(struct archive *_a, int64_t d, int64_t i)
{
	struct archive_write *a = (struct archive_write *)_a;
	archive_check_magic(&a->archive, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_write_set_skip_file");
	a->skip_file_set = 1;
	a->skip_file_dev = d;
	a->skip_file_ino = i;
	return (ARCHIVE_OK);
}